

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

_Bool Curl_conn_is_ip_connected(Curl_easy *data,int sockindex)

{
  byte bVar1;
  Curl_cfilter *pCVar2;
  
  pCVar2 = data->conn->cfilter[sockindex];
  if (pCVar2 == (Curl_cfilter *)0x0) {
    bVar1 = 0;
  }
  else {
    do {
      bVar1 = pCVar2->field_0x24;
      if (((bVar1 & 1) != 0) || ((pCVar2->cft->flags & 1) != 0)) break;
      pCVar2 = pCVar2->next;
    } while (pCVar2 != (Curl_cfilter *)0x0);
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool Curl_conn_is_ip_connected(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->connected)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
    cf = cf->next;
  }
  return FALSE;
}